

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeSharedArrayBufferPrototype
               (DynamicObject *sharedArrayBufferPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  RuntimeFunction **ppRVar2;
  ScriptConfiguration *this_01;
  JavascriptString *value;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *sharedArrayBufferPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,sharedArrayBufferPrototype,mode,4,0);
  this = RecyclableObject::GetScriptContext(&sharedArrayBufferPrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&sharedArrayBufferPrototype->super_RecyclableObject);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&this_00->sharedArrayBufferConstructor);
  AddMember(this_00,sharedArrayBufferPrototype,0x67,*ppRVar2);
  AddFunctionToLibraryObject
            (this_00,sharedArrayBufferPrototype,0x150,
             (FunctionInfo *)SharedArrayBuffer::EntryInfo::Slice,2,'\x06');
  AddAccessorsToLibraryObject
            (this_00,sharedArrayBufferPrototype,0x1a9,
             (FunctionInfo *)SharedArrayBuffer::EntryInfo::GetterByteLength,(FunctionInfo *)0x0);
  this_01 = ScriptContext::GetConfig(this);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(this_01);
  if (bVar1) {
    value = CreateStringFromCppLiteral<18ul>(this_00,(char16 (*) [18])0x1995212);
    AddMember(this_00,sharedArrayBufferPrototype,0x1b,value,'\x02');
  }
  DynamicObject::SetHasNoEnumerableProperties(sharedArrayBufferPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeSharedArrayBufferPrototype(DynamicObject* sharedArrayBufferPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(sharedArrayBufferPrototype, mode, 4);

        ScriptContext* scriptContext = sharedArrayBufferPrototype->GetScriptContext();
        JavascriptLibrary* library = sharedArrayBufferPrototype->GetLibrary();
        library->AddMember(sharedArrayBufferPrototype, PropertyIds::constructor, library->sharedArrayBufferConstructor);
        library->AddFunctionToLibraryObject(sharedArrayBufferPrototype, PropertyIds::slice, &SharedArrayBuffer::EntryInfo::Slice, 2);
        library->AddAccessorsToLibraryObject(sharedArrayBufferPrototype, PropertyIds::byteLength, &SharedArrayBuffer::EntryInfo::GetterByteLength, nullptr);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(sharedArrayBufferPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("SharedArrayBuffer")), PropertyConfigurable);
        }

        sharedArrayBufferPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }